

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzpolynomial.cpp
# Opt level: O0

int __thiscall TPZPolynomial::SetRoots(TPZPolynomial *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double *pdVar7;
  double *pdVar8;
  ostream *poVar9;
  TPZVec<double> *copy;
  double *in_RDI;
  double dVar10;
  TPZVec<double> *this_00;
  double dVar11;
  double dVar12;
  REAL delta;
  REAL b3;
  REAL b2;
  REAL b1;
  REAL teste;
  int zero;
  int j;
  int i;
  REAL der;
  REAL tol;
  REAL x;
  TPZManVector<double,_3> X;
  TPZManVector<double,_3> *in_stack_fffffffffffffba0;
  TPZVec<double> *in_stack_fffffffffffffba8;
  TPZVec<double> *in_stack_fffffffffffffbb0;
  int64_t in_stack_fffffffffffffbb8;
  TPZManVector<double,_3> *in_stack_fffffffffffffbc0;
  int local_6c;
  int local_68;
  int local_64;
  double local_50;
  TPZVec<double> local_48 [2];
  int local_4;
  
  TPZManVector<double,_3>::TPZManVector(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  local_6c = 0;
  for (local_64 = 0; local_64 < 4; local_64 = local_64 + 1) {
    pdVar7 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 1),(long)local_64);
    if (ABS(*pdVar7) < *in_RDI) {
      local_6c = local_6c + 1;
    }
  }
  if (local_6c == 4) {
    for (local_64 = 0; local_64 < 3; local_64 = local_64 + 1) {
      pdVar7 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 5),(long)local_64);
      *pdVar7 = 0.0;
    }
    local_4 = 1;
  }
  else {
    pdVar7 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 1),0);
    if ((*in_RDI <= ABS(*pdVar7)) ||
       (pdVar7 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 1),1),
       *in_RDI <= ABS(*pdVar7))) {
      for (local_64 = 0; local_64 < 3; local_64 = local_64 + 1) {
        pdVar7 = TPZVec<double>::operator[](local_48,(long)local_64);
        *pdVar7 = -99.999;
      }
      pdVar7 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 1),2);
      local_50 = *pdVar7 + 1.0;
      local_68 = 0;
      while (local_68 < 10000) {
        local_68 = local_68 + 1;
        pdVar7 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 1),3);
        dVar10 = *pdVar7;
        pdVar7 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 1),2);
        dVar11 = *pdVar7;
        pdVar7 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 1),1);
        dVar10 = dVar10 * 3.0 * local_50 * local_50 + (dVar11 + dVar11) * local_50 + *pdVar7;
        if (*in_RDI <= ABS(dVar10)) {
          pdVar7 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 1),3);
          dVar11 = *pdVar7;
          pdVar7 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 1),2);
          dVar12 = *pdVar7;
          pdVar7 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 1),1);
          dVar1 = *pdVar7;
          pdVar7 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 1),0);
          dVar2 = *pdVar7;
          pdVar7 = TPZVec<double>::operator[](local_48,0);
          *pdVar7 = local_50 -
                    (dVar1 * local_50 +
                     dVar11 * local_50 * local_50 * local_50 + dVar12 * local_50 * local_50 + dVar2)
                    / dVar10;
        }
        else {
          local_68 = 0x2712;
        }
        pdVar7 = TPZVec<double>::operator[](local_48,0);
        if (ABS(local_50 - *pdVar7) <= *in_RDI) {
          local_68 = 0x2711;
        }
        pdVar7 = TPZVec<double>::operator[](local_48,0);
        local_50 = *pdVar7;
      }
      if ((local_68 == 0x2712) || (local_68 == 10000)) {
        local_50 = local_50 * -100000.0;
        local_68 = 0;
        while (local_68 < 10000) {
          local_68 = local_68 + 1;
          pdVar7 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 1),3);
          dVar10 = *pdVar7;
          pdVar7 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 1),2);
          dVar11 = *pdVar7;
          pdVar7 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 1),1);
          dVar10 = dVar10 * 3.0 * local_50 * local_50 + (dVar11 + dVar11) * local_50 + *pdVar7;
          if (*in_RDI < ABS(dVar10)) {
            pdVar7 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 1),3);
            dVar11 = *pdVar7;
            pdVar7 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 1),2);
            dVar12 = *pdVar7;
            pdVar7 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 1),1);
            dVar1 = *pdVar7;
            pdVar7 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 1),0);
            dVar2 = *pdVar7;
            pdVar7 = TPZVec<double>::operator[](local_48,0);
            *pdVar7 = local_50 -
                      (dVar1 * local_50 +
                       dVar11 * local_50 * local_50 * local_50 + dVar12 * local_50 * local_50 +
                      dVar2) / dVar10;
          }
          else {
            local_68 = 0x2712;
          }
          pdVar7 = TPZVec<double>::operator[](local_48,0);
          if (ABS(local_50 - *pdVar7) <= *in_RDI) {
            local_68 = 0x3e9;
          }
          pdVar7 = TPZVec<double>::operator[](local_48,0);
          local_50 = *pdVar7;
        }
      }
      if ((local_68 == 0x2712) || (local_68 == 10000)) {
        poVar9 = std::operator<<((ostream *)&std::cout,
                                 "TPZPolynomial::SetRoots().\nErro no calculo das raizes!!!!! j= ");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_68);
        std::operator<<(poVar9,"\n");
        local_4 = -1;
        goto LAB_010a12e2;
      }
      pdVar7 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 1),3);
      dVar10 = *pdVar7;
      pdVar7 = TPZVec<double>::operator[](local_48,0);
      dVar11 = *pdVar7;
      pdVar7 = TPZVec<double>::operator[](local_48,0);
      dVar12 = *pdVar7;
      pdVar7 = TPZVec<double>::operator[](local_48,0);
      dVar1 = *pdVar7;
      pdVar7 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 1),2);
      dVar2 = *pdVar7;
      pdVar7 = TPZVec<double>::operator[](local_48,0);
      dVar3 = *pdVar7;
      pdVar7 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 1),1);
      dVar4 = *pdVar7;
      pdVar7 = TPZVec<double>::operator[](local_48,0);
      dVar5 = *pdVar7;
      pdVar7 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 1),0);
      dVar6 = *pdVar7;
      poVar9 = std::operator<<((ostream *)&std::cout,"Resultado da 1a raiz na equacao");
      poVar9 = (ostream *)
               std::ostream::operator<<
                         (poVar9,dVar4 * dVar5 + dVar10 * dVar11 * dVar12 * dVar1 + dVar2 * dVar3 +
                                 dVar6);
      std::operator<<(poVar9,"\n");
      pdVar7 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 1),3);
      dVar10 = *pdVar7;
      pdVar7 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 1),2);
      dVar11 = *pdVar7;
      pdVar7 = TPZVec<double>::operator[](local_48,0);
      this_00 = (TPZVec<double> *)(*pdVar7 * dVar10 + dVar11);
      pdVar7 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 1),1);
      dVar11 = *pdVar7;
      pdVar7 = TPZVec<double>::operator[](local_48,0);
      dVar11 = *pdVar7 * (double)this_00 + dVar11;
      dVar12 = (double)this_00 * (double)this_00 + -(dVar11 * 4.0 * dVar10);
      if (0.0 <= dVar12) {
        dVar11 = sqrt(dVar12);
        pdVar7 = TPZVec<double>::operator[](local_48,1);
        *pdVar7 = (-(double)this_00 - dVar11) / (dVar10 + dVar10);
        dVar11 = sqrt(dVar12);
        dVar10 = (dVar11 - (double)this_00) / (dVar10 + dVar10);
        pdVar7 = TPZVec<double>::operator[](local_48,2);
        *pdVar7 = dVar10;
        copy = (TPZVec<double> *)TPZVec<double>::operator[](local_48,0);
        in_stack_fffffffffffffba0 =
             (TPZManVector<double,_3> *)TPZVec<double>::operator[](local_48,3);
        std::sort<double*,std::greater<double>>(copy,in_stack_fffffffffffffba0);
        TPZVec<double>::operator=(this_00,copy);
      }
      else {
        poVar9 = std::operator<<((ostream *)&std::cerr,
                                 "TPZPolynomial::SetRoots() - warning: Raizes nao reais!! Delta =");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,dVar12);
        poVar9 = std::operator<<(poVar9,"\t");
        pdVar7 = TPZVec<double>::operator[](local_48,0);
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,*pdVar7);
        std::operator<<(poVar9,"\n");
        pdVar7 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 1),3);
        poVar9 = (ostream *)std::ostream::operator<<(&std::cout,*pdVar7);
        poVar9 = std::operator<<(poVar9,"x >= + ");
        pdVar7 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 1),2);
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,*pdVar7);
        poVar9 = std::operator<<(poVar9,"x <= + ");
        pdVar7 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 1),1);
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,*pdVar7);
        poVar9 = std::operator<<(poVar9,"x + ");
        pdVar7 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 1),0);
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,*pdVar7);
        std::operator<<(poVar9," = 0.0\n");
        poVar9 = (ostream *)std::ostream::operator<<(&std::cout,dVar10);
        poVar9 = std::operator<<(poVar9,"x<= + ");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,(double)this_00);
        poVar9 = std::operator<<(poVar9,"x + ");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,dVar11);
        std::operator<<(poVar9," = 0.0\n");
        pdVar7 = TPZVec<double>::operator[](local_48,1);
        *pdVar7 = 0.0;
        pdVar7 = TPZVec<double>::operator[](local_48,2);
        *pdVar7 = 0.0;
        pdVar7 = TPZVec<double>::operator[](local_48,0);
        pdVar8 = TPZVec<double>::operator[](local_48,3);
        std::sort<double*,std::greater<double>>(pdVar7,pdVar8);
        TPZVec<double>::operator=(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
      }
    }
    else {
      pdVar7 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 1),2);
      dVar10 = *pdVar7;
      pdVar7 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 1),3);
      dVar11 = *pdVar7;
      pdVar7 = TPZVec<double>::operator[](local_48,0);
      *pdVar7 = dVar10 / dVar11;
      pdVar7 = TPZVec<double>::operator[](local_48,1);
      *pdVar7 = 0.0;
      pdVar7 = TPZVec<double>::operator[](local_48,2);
      *pdVar7 = 0.0;
      pdVar7 = TPZVec<double>::operator[](local_48,0);
      pdVar8 = TPZVec<double>::operator[](local_48,3);
      std::sort<double*,std::greater<double>>(pdVar7,pdVar8);
      TPZVec<double>::operator=(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
    }
    local_4 = 1;
  }
LAB_010a12e2:
  TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffba0);
  return local_4;
}

Assistant:

int TPZPolynomial::SetRoots() {
    TPZManVector<REAL,3> X(3);
	REAL x;
    REAL tol = -99.999;
    REAL der;
    int i, j;
    int zero = 0;
    for (i = 0; i < 4; i++)
        if (fabs(fCo[i]) < fTolerance) zero++;
    if (zero == 4) {
        for (i = 0; i < 3; i++) fReal[i] = 0.000;
        return 1;
    }
    else {
        if (fabs(fCo[0]) < fTolerance && fabs(fCo[1]) < fTolerance) {
            X[0] = fCo[2] / fCo[3];
            X[1] = 0.0;
            X[2] = 0.0;
			sort(&X[0], &X[3], greater<REAL>());
			fReal = X;
//			copy(&X[0], &X[3], &fReal[0]);
        }
        else {
            // Primeira aproximacao
            for (i = 0; i < 3; i++) X[i] = -99.999;
            x = fCo[2] + 1.0;
            j = 0;
            while (j < 10000) {
                j++;
                der = 3.0 * fCo[3] * x * x + 2.0 * fCo[2] * x + fCo[1];
                if (fabs(der) < fTolerance) j = 10002;
                else X[0] = x - ((fCo[3] * x * x * x + fCo[2] * x * x + fCo[1] * x + fCo[0]) / der);
                tol = fabs(x - X[0]);
                if (tol <= fTolerance) j = 10001;
                x = X[0];
            }
            //Caso falhe a primeira aproxima��o
            if (j == 10002 || j == 10000) {
                x = -1e5 * x;
                j = 0;
                while (j < 10000) {
                    j++;
                    der = 3.0 * fCo[3] * x * x + 2.0 * fCo[2] * x + fCo[1];
                    if (fabs(der) <= fTolerance) j = 10002;
                    else X[0] = x - ((fCo[3] * x * x * x + fCo[2] * x * x + fCo[1] * x + fCo[0]) / der);
                    tol = fabs(x - X[0]);
                    if (tol <= fTolerance) j = 1001;
                    x = X[0];
                }
            }
            if (j == 10002 || j == 10000) {
                cout << "TPZPolynomial::SetRoots().\nErro no calculo das raizes!!!!! j= " << j << "\n";
                return -1;
            }
            REAL teste;
            teste = fCo[3] * X[0] * X[0] * X[0] + fCo[2] * X[0] + fCo[1] * X[0] + fCo[0];
            cout << "Resultado da 1a raiz na equacao" << teste << "\n";
            //Fim do calculo da primeira raiz (X[0])
            //Reducao da equacao caracteristica de grau 2.
			REAL  b1, b2, b3;
			b3 = fCo[3];
			b2 = fCo[2] + X[0] * b3;
			b1 = fCo[1] + X[0] * b2;
			
            /** Calculo das outras duas raizes (X[1] e X[2]) b3*x^2 + b2*x + b1 = 0 */
            REAL delta;
            delta = b2 * b2 - 4.0 * b1 * b3;
            if (delta < 0.0) {
                cerr << "TPZPolynomial::SetRoots() - warning: Raizes nao reais!! Delta =" << delta << "\t" << X[0] << "\n";
                cout << fCo[3] << "x >= + " << fCo[2] << "x <= + " << fCo[1] << "x + " << fCo[0] << " = 0.0\n";
                cout << b3 << "x<= + " << b2 << "x + " << b1 << " = 0.0\n";
                X[1] = 0.0;
                X[2] = 0.0;
                sort(&X[0], &X[3], greater<REAL>());
				fReal = X;
            }
            else {
                X[1] = (-b2 - sqrt(delta)) / (2.0 * b3);
                X[2] = (-b2 + sqrt(delta)) / (2.0 * b3);
                // Ordenando as tensoes de forma crescente
                sort(&X[0], &X[3], greater<REAL>());
				fReal = X;
            }
        }
    }
    return 1;
}